

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>::
ReadColumnSizes<false>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
           *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ColumnSizeHandler size_handler;
  undefined1 local_38 [24];
  char *local_20;
  
  iVar2 = (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  uVar3 = iVar2 - 1;
  uVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
  if (uVar1 != uVar3) {
    local_38._0_8_ = ZEXT48(uVar3);
    local_38._16_8_ = (_func_int **)0x2;
    local_20 = local_38;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x26a0b9,
               (ArgList *)(local_38 + 0x10));
  }
  TestNLHandler::OnColumnSizes((TestNLHandler *)local_38);
  if (1 < iVar2) {
    do {
      iVar2 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
      TestNLHandler::ColumnSizeHandler::Add((ColumnSizeHandler *)local_38,iVar2);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  TestNLHandler::ColumnSizeHandler::~ColumnSizeHandler((ColumnSizeHandler *)local_38);
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadColumnSizes() {
  int num_sizes = header_.num_vars - 1;
  if (reader_.ReadUInt() != num_sizes)
    reader_.ReportError("expected {}", num_sizes);
  reader_.ReadTillEndOfLine();
  typename Handler::ColumnSizeHandler size_handler = handler_.OnColumnSizes();
  int prev_size = 0;
  for (int i = 0; i < num_sizes; ++i) {
    int size = reader_.ReadUInt();
    if (CUMULATIVE) {
      if (size < prev_size)
        reader_.ReportError("invalid column offset");
      size -= prev_size;
      prev_size += size;
    }
    size_handler.Add(size);
    reader_.ReadTillEndOfLine();
  }
}